

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5TextFromStmt(Fts5Config *pConfig,sqlite3_stmt *pStmt,int iCol,char **ppText,int *pnText)

{
  long lVar1;
  int iVar2;
  sqlite3_value *pVal_00;
  uchar *puVar3;
  int *in_RCX;
  undefined4 in_EDX;
  sqlite3_value *in_RSI;
  Fts5Config *in_RDI;
  Fts5Config *in_R8;
  long in_FS_OFFSET;
  int rc;
  sqlite3_value *pVal;
  int nLoc;
  char *pLoc;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar4;
  undefined4 in_stack_ffffffffffffffd0;
  int local_14;
  uchar *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVal_00 = sqlite3_column_value
                      ((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                       ,in_stack_ffffffffffffffac);
  local_10 = (uchar *)0x0;
  local_14 = 0;
  iVar4 = 0;
  if (((in_RDI->bLocale == 0) || (in_RDI->eContent != 2)) ||
     (iVar2 = sqlite3Fts5IsLocaleValue(in_R8,pVal_00), iVar2 == 0)) {
    puVar3 = sqlite3_value_text((sqlite3_value *)0x283391);
    *(uchar **)in_RCX = puVar3;
    iVar2 = sqlite3_value_bytes((sqlite3_value *)0x2833a6);
    *(int *)&in_R8->db = iVar2;
    if ((in_RDI->bLocale != 0) && (in_RDI->eContent == 0)) {
      local_10 = sqlite3_column_text((sqlite3_stmt *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                                     in_stack_ffffffffffffffac);
      local_14 = sqlite3_column_bytes
                           ((sqlite3_stmt *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffac);
    }
  }
  else {
    iVar4 = sqlite3Fts5DecodeLocaleValue
                      (in_RSI,(char **)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),in_RCX,
                       (char **)in_R8,(int *)pVal_00);
  }
  sqlite3Fts5SetLocale(in_RDI,(char *)local_10,local_14);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts5TextFromStmt(
  Fts5Config *pConfig,
  sqlite3_stmt *pStmt,
  int iCol,
  const char **ppText,
  int *pnText
){
  sqlite3_value *pVal = sqlite3_column_value(pStmt, iCol+1);
  const char *pLoc = 0;
  int nLoc = 0;
  int rc = SQLITE_OK;

  if( pConfig->bLocale
   && pConfig->eContent==FTS5_CONTENT_EXTERNAL
   && sqlite3Fts5IsLocaleValue(pConfig, pVal)
  ){
    rc = sqlite3Fts5DecodeLocaleValue(pVal, ppText, pnText, &pLoc, &nLoc);
  }else{
    *ppText = (const char*)sqlite3_value_text(pVal);
    *pnText = sqlite3_value_bytes(pVal);
    if( pConfig->bLocale && pConfig->eContent==FTS5_CONTENT_NORMAL ){
      pLoc = (const char*)sqlite3_column_text(pStmt, iCol+1+pConfig->nCol);
      nLoc = sqlite3_column_bytes(pStmt, iCol+1+pConfig->nCol);
    }
  }
  sqlite3Fts5SetLocale(pConfig, pLoc, nLoc);
  return rc;
}